

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  void *pvVar1;
  ARKodeHAdaptMem pAVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  code *pcVar7;
  int iVar8;
  int error_code;
  char *msgfmt;
  long lVar9;
  size_t __nmemb;
  long lVar10;
  size_t __nmemb_00;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    arkProcessError(ark_mem,-0x15,0x9a4,"arkStep_Init",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  if (init_type == 1) {
    return 0;
  }
  if (init_type == 0) {
    bVar3 = ((ark_mem->user_efun == 0 && ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE) &&
            *(int *)((long)pvVar1 + 0x20) == 0) && ark_mem->fixedstep != 0;
    if (ark_mem->rwt_is_ewt != 0) {
      bVar3 = (bVar3 && *(int *)((long)pvVar1 + 0x184) != 1) && *(int *)((long)pvVar1 + 0x184) != 2;
    }
    if (bVar3) {
      ark_mem->user_efun = 0;
      ark_mem->efun = arkEwtSetSmallReal;
      ark_mem->e_data = ark_mem;
    }
    iVar4 = arkStep_SetButcherTables(ark_mem);
    if (iVar4 != 0) {
      msgfmt = "Could not create Butcher table(s)";
      iVar8 = -0x16;
      error_code = -0x16;
      iVar4 = 0x3de;
      goto LAB_00123d15;
    }
    iVar4 = arkStep_CheckButcherTables(ark_mem);
    if (iVar4 != 0) {
      msgfmt = "Error in Butcher table(s)";
      iVar8 = -0x16;
      error_code = -0x16;
      iVar4 = 999;
      goto LAB_00123d15;
    }
    piVar5 = *(int **)((long)pvVar1 + 0x78);
    if (piVar5 == (int *)0x0) {
      piVar5 = *(int **)((long)pvVar1 + 0x70);
    }
    iVar4 = *piVar5;
    pAVar2 = ark_mem->hadapt_mem;
    pAVar2->q = iVar4;
    *(int *)((long)pvVar1 + 0x60) = iVar4;
    iVar4 = piVar5[1];
    pAVar2->p = iVar4;
    *(int *)((long)pvVar1 + 100) = iVar4;
    if (((ark_mem->fixedstep == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) &&
       (*(int *)((long)pvVar1 + 100) < 1)) {
      msgfmt = "Temporal error estimation cannot be performed without embedding coefficients";
      iVar8 = -0x16;
      error_code = -0x16;
      iVar4 = 0x3fd;
      goto LAB_00123d15;
    }
    if (((ark_mem->relax_enabled != 0) && (*(int *)((long)pvVar1 + 0x20) != 0)) &&
       (*(int *)((long)pvVar1 + 0x24) != 0)) {
      msgfmt = "Relaxation cannot be performed when deducing implicit RHS values";
      iVar8 = -0x16;
      error_code = -0x16;
      iVar4 = 0x405;
      goto LAB_00123d15;
    }
    if (*(int *)((long)pvVar1 + 0x1c) != 0) {
      if (*(long *)((long)pvVar1 + 0x30) == 0) {
        pvVar6 = calloc((long)*(int *)((long)pvVar1 + 0x6c),8);
        *(void **)((long)pvVar1 + 0x30) = pvVar6;
      }
      iVar4 = *(int *)((long)pvVar1 + 0x6c);
      if (0 < iVar4) {
        lVar10 = 0;
        lVar9 = 0;
        do {
          iVar4 = arkAllocVec(ark_mem,ark_mem->ewt,
                              (N_Vector *)(*(long *)((long)pvVar1 + 0x30) + lVar10));
          if (iVar4 == 0) {
            return -0x14;
          }
          lVar9 = lVar9 + 1;
          iVar4 = *(int *)((long)pvVar1 + 0x6c);
          lVar10 = lVar10 + 8;
        } while (lVar9 < iVar4);
      }
      ark_mem->liw = ark_mem->liw + (long)iVar4;
    }
    if (*(int *)((long)pvVar1 + 0x20) != 0) {
      if (*(long *)((long)pvVar1 + 0x38) == 0) {
        pvVar6 = calloc((long)*(int *)((long)pvVar1 + 0x6c),8);
        *(void **)((long)pvVar1 + 0x38) = pvVar6;
      }
      iVar4 = *(int *)((long)pvVar1 + 0x6c);
      if (0 < iVar4) {
        lVar10 = 0;
        lVar9 = 0;
        do {
          iVar4 = arkAllocVec(ark_mem,ark_mem->ewt,
                              (N_Vector *)(*(long *)((long)pvVar1 + 0x38) + lVar10));
          if (iVar4 == 0) {
            return -0x14;
          }
          lVar9 = lVar9 + 1;
          iVar4 = *(int *)((long)pvVar1 + 0x6c);
          lVar10 = lVar10 + 8;
        } while (lVar9 < iVar4);
      }
      ark_mem->liw = ark_mem->liw + (long)iVar4;
    }
    if ((ark_mem->relax_enabled != 0) &&
       ((*(int *)((long)pvVar1 + 0x20) != 0 || (*(int *)((long)pvVar1 + 0x180) == 1)))) {
      if (*(long *)((long)pvVar1 + 0x40) == 0) {
        pvVar6 = calloc((long)*(int *)((long)pvVar1 + 0x6c),8);
        *(void **)((long)pvVar1 + 0x40) = pvVar6;
      }
      iVar4 = *(int *)((long)pvVar1 + 0x6c);
      if (0 < iVar4) {
        lVar10 = 0;
        lVar9 = 0;
        do {
          iVar4 = arkAllocVec(ark_mem,ark_mem->ewt,
                              (N_Vector *)(*(long *)((long)pvVar1 + 0x40) + lVar10));
          if (iVar4 == 0) {
            return -0x14;
          }
          lVar9 = lVar9 + 1;
          iVar4 = *(int *)((long)pvVar1 + 0x6c);
          lVar10 = lVar10 + 8;
        } while (lVar9 < iVar4);
      }
      ark_mem->liw = ark_mem->liw + (long)iVar4;
    }
    __nmemb_00 = (size_t)*(int *)((long)pvVar1 + 0x6c);
    __nmemb = (long)*(int *)((long)pvVar1 + 0x1e8) + __nmemb_00 * 2 + 2;
    iVar4 = (int)__nmemb;
    *(int *)((long)pvVar1 + 0x1c0) = iVar4;
    if (*(long *)((long)pvVar1 + 0x1b0) == 0) {
      pvVar6 = calloc(__nmemb,8);
      *(void **)((long)pvVar1 + 0x1b0) = pvVar6;
      if (pvVar6 == (void *)0x0) {
        return -0x14;
      }
      ark_mem->lrw = ark_mem->lrw + __nmemb;
    }
    if (*(long *)((long)pvVar1 + 0x1b8) == 0) {
      pvVar6 = calloc((long)iVar4,8);
      *(void **)((long)pvVar1 + 0x1b8) = pvVar6;
      if (pvVar6 == (void *)0x0) {
        return -0x14;
      }
      ark_mem->liw = ark_mem->liw + (long)iVar4;
    }
    if ((*(int *)((long)pvVar1 + 0x1c4) != 0) || (*(int *)((long)pvVar1 + 0x1c8) != 0)) {
      if (*(long *)((long)pvVar1 + 0x1f0) == 0) {
        pvVar6 = calloc(__nmemb_00,8);
        *(void **)((long)pvVar1 + 0x1f0) = pvVar6;
        ark_mem->lrw = ark_mem->lrw + __nmemb_00;
      }
      if (*(long *)((long)pvVar1 + 0x1f8) == 0) {
        pvVar6 = calloc(__nmemb_00,8);
        *(void **)((long)pvVar1 + 0x1f8) = pvVar6;
        ark_mem->lrw = ark_mem->lrw + __nmemb_00;
      }
    }
    iVar4 = *(int *)((long)pvVar1 + 0x60);
    if ((iVar4 < 2) || (ark_mem->interp_degree < iVar4)) {
      if ((iVar4 == 1) && (1 < ark_mem->interp_degree)) {
        ark_mem->interp_degree = 1;
      }
    }
    else {
      ark_mem->interp_degree = iVar4 + -1;
    }
    if ((ark_mem->interp_type == -1) && (*(int *)((long)pvVar1 + 0xc0) != 0)) {
      msgfmt = "Non-trival predictors require an interpolation module";
      iVar8 = -0x16;
      error_code = -0x16;
      iVar4 = 0x476;
      goto LAB_00123d15;
    }
  }
  if (ark_mem->do_adjoint == 0) {
    pcVar7 = arkStep_TakeStep_Z;
  }
  else {
    pcVar7 = arkStep_TakeStep_ERK_Adjoint;
  }
  ark_mem->step = pcVar7;
  if (*(int *)((long)pvVar1 + 0x180) != 0) {
    if ((*(long *)((long)pvVar1 + 0x140) != 0) &&
       (*(int *)((long)pvVar1 + 0x148) != *(int *)((long)pvVar1 + 0x184))) {
      msgfmt = "Incompatible linear and mass matrix solvers";
      iVar8 = -0x16;
      error_code = -0x16;
      iVar4 = 0x486;
      goto LAB_00123d15;
    }
    if (*(int *)((long)pvVar1 + 0x180) != 0) {
      if ((*(code **)((long)pvVar1 + 0x150) != (code *)0x0) &&
         (iVar4 = (**(code **)((long)pvVar1 + 0x150))(ark_mem), iVar4 != 0)) {
        msgfmt = "The mass matrix solver\'s init routine failed.";
        iVar8 = -0xe;
        error_code = -0xe;
        iVar4 = 0x495;
        goto LAB_00123d15;
      }
      if ((*(code **)((long)pvVar1 + 0x158) != (code *)0x0) &&
         (iVar4 = (**(code **)((long)pvVar1 + 0x158))
                            (ark_mem->tcur,ark_mem,ark_mem->tempv1,ark_mem->tempv2,ark_mem->tempv3),
         iVar4 != 0)) {
        msgfmt = "The mass matrix solver\'s setup routine failed.";
        iVar8 = -0xf;
        error_code = -0xf;
        iVar4 = 0x4a2;
        goto LAB_00123d15;
      }
    }
  }
  if ((*(code **)((long)pvVar1 + 0x120) == (code *)0x0) ||
     (iVar4 = (**(code **)((long)pvVar1 + 0x120))(ark_mem), iVar4 == 0)) {
    if ((*(long *)((long)pvVar1 + 0x88) == 0) || (iVar4 = arkStep_NlsInit(ark_mem), iVar4 == 0)) {
      ark_mem->call_fullrhs = 1;
      return 0;
    }
    msgfmt = "Unable to initialize SUNNonlinearSolver object";
    iVar8 = -0x1d;
    error_code = -0x1d;
    iVar4 = 0x4bb;
  }
  else {
    msgfmt = "The linear solver\'s init routine failed.";
    iVar8 = -5;
    error_code = -5;
    iVar4 = 0x4af;
  }
LAB_00123d15:
  arkProcessError(ark_mem,error_code,iVar4,"arkStep_Init",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                  ,msgfmt);
  return iVar8;
}

Assistant:

int arkStep_Init(ARKodeMem ark_mem, SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                 int init_type)
{
  ARKodeARKStepMem step_mem;
  int j, retval;
  sunbooleantype reset_efun;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if reset */
  if (init_type == RESET_INIT) { return (ARK_SUCCESS); }

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT)
  {
    /* enforce use of arkEwtSmallReal if using a fixed step size for
       an explicit method, an internal error weight function, not
       using an iterative mass matrix solver with rwt=ewt, and not
       performing accumulated temporal error estimation */
    reset_efun = SUNTRUE;
    if (step_mem->implicit) { reset_efun = SUNFALSE; }
    if (!ark_mem->fixedstep) { reset_efun = SUNFALSE; }
    if (ark_mem->user_efun) { reset_efun = SUNFALSE; }
    if (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)
    {
      reset_efun = SUNFALSE;
    }
    if (ark_mem->rwt_is_ewt &&
        (step_mem->msolve_type == SUNLINEARSOLVER_ITERATIVE))
    {
      reset_efun = SUNFALSE;
    }
    if (ark_mem->rwt_is_ewt &&
        (step_mem->msolve_type == SUNLINEARSOLVER_MATRIX_ITERATIVE))
    {
      reset_efun = SUNFALSE;
    }
    if (reset_efun)
    {
      ark_mem->user_efun = SUNFALSE;
      ark_mem->efun      = arkEwtSetSmallReal;
      ark_mem->e_data    = ark_mem;
    }

    /* Create Butcher tables (if not already set) */
    retval = arkStep_SetButcherTables(ark_mem);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Could not create Butcher table(s)");
      return (ARK_ILL_INPUT);
    }

    /* Check that Butcher tables are OK */
    retval = arkStep_CheckButcherTables(ark_mem);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Error in Butcher table(s)");
      return (ARK_ILL_INPUT);
    }

    /* Retrieve/store method and embedding orders now that tables are finalized */
    if (step_mem->Bi != NULL)
    {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Bi->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Bi->p;
    }
    else
    {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Be->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Be->p;
    }

    /* Ensure that if adaptivity or error accumulation is enabled, then
       method includes embedding coefficients */
    if ((!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) &&
        (step_mem->p <= 0))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Temporal error estimation cannot be performed without embedding coefficients");
      return (ARK_ILL_INPUT);
    }

    /* Relaxation is incompatible with implicit RHS deduction */
    if (ark_mem->relax_enabled && step_mem->implicit && step_mem->deduce_rhs)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Relaxation cannot be performed when deducing implicit RHS values");
      return ARK_ILL_INPUT;
    }

    /* Allocate ARK RHS vector memory, update storage requirements */
    /*   Allocate Fe[0] ... Fe[stages-1] if needed */
    if (step_mem->explicit)
    {
      if (step_mem->Fe == NULL)
      {
        step_mem->Fe = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
      }
      for (j = 0; j < step_mem->stages; j++)
      {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fe[j])))
        {
          return (ARK_MEM_FAIL);
        }
      }
      ark_mem->liw += step_mem->stages; /* pointers */
    }

    /*   Allocate Fi[0] ... Fi[stages-1] if needed */
    if (step_mem->implicit)
    {
      if (step_mem->Fi == NULL)
      {
        step_mem->Fi = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
      }
      for (j = 0; j < step_mem->stages; j++)
      {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fi[j])))
        {
          return (ARK_MEM_FAIL);
        }
      }
      ark_mem->liw += step_mem->stages; /* pointers */
    }

    /* Allocate stage storage for relaxation with implicit/IMEX methods or if a
       fixed mass matrix is present (since we store f(t,y) not M^{-1} f(t,y)) */
    if (ark_mem->relax_enabled &&
        (step_mem->implicit || step_mem->mass_type == MASS_FIXED))
    {
      if (step_mem->z == NULL)
      {
        step_mem->z = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
      }
      for (j = 0; j < step_mem->stages; j++)
      {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->z[j])))
        {
          return (ARK_MEM_FAIL);
        }
      }
      ark_mem->liw += step_mem->stages; /* pointers */
    }

    /* Allocate reusable arrays for fused vector operations */
    step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + step_mem->nforcing;
    if (step_mem->cvals == NULL)
    {
      step_mem->cvals = (sunrealtype*)calloc(step_mem->nfusedopvecs,
                                             sizeof(sunrealtype));
      if (step_mem->cvals == NULL) { return (ARK_MEM_FAIL); }
      ark_mem->lrw += step_mem->nfusedopvecs;
    }
    if (step_mem->Xvecs == NULL)
    {
      step_mem->Xvecs = (N_Vector*)calloc(step_mem->nfusedopvecs,
                                          sizeof(N_Vector));
      if (step_mem->Xvecs == NULL) { return (ARK_MEM_FAIL); }
      ark_mem->liw += step_mem->nfusedopvecs; /* pointers */
    }

    /* Allocate workspace for MRI forcing -- need to allocate here as the
       number of stages may not bet set before this point and we assume
       SetInnerForcing has been called before the first step i.e., methods
       start with a fast integration */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (!(step_mem->stage_times))
      {
        step_mem->stage_times = (sunrealtype*)calloc(step_mem->stages,
                                                     sizeof(sunrealtype));
        ark_mem->lrw += step_mem->stages;
      }

      if (!(step_mem->stage_coefs))
      {
        step_mem->stage_coefs = (sunrealtype*)calloc(step_mem->stages,
                                                     sizeof(sunrealtype));
        ark_mem->lrw += step_mem->stages;
      }
    }

    /* Override the interpolant degree (if needed), used in arkInitialSetup */
    if (step_mem->q > 1 && ark_mem->interp_degree > (step_mem->q - 1))
    {
      /* Limit max degree to at most one less than the method global order */
      ark_mem->interp_degree = step_mem->q - 1;
    }
    else if (step_mem->q == 1 && ark_mem->interp_degree > 1)
    {
      /* Allow for linear interpolant with first order methods to ensure
         solution values are returned at the time interval end points */
      ark_mem->interp_degree = 1;
    }

    /* Higher-order predictors require interpolation */
    if (ark_mem->interp_type == ARK_INTERP_NONE && step_mem->predictor != 0)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Non-trival predictors require an interpolation module");
      return ARK_ILL_INPUT;
    }
  }

  /* set appropriate TakeStep routine based on problem configuration */
  if (ark_mem->do_adjoint) { ark_mem->step = arkStep_TakeStep_ERK_Adjoint; }
  else { ark_mem->step = arkStep_TakeStep_Z; }

  /* Check for consistency between mass system and system linear system modules
     (e.g., if lsolve is direct, msolve needs to match) */
  if ((step_mem->mass_type != MASS_IDENTITY) && step_mem->lmem)
  {
    if (step_mem->lsolve_type != step_mem->msolve_type)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Incompatible linear and mass matrix solvers");
      return (ARK_ILL_INPUT);
    }
  }

  /* Perform mass matrix solver initialization and setup (if applicable) */
  if (step_mem->mass_type != MASS_IDENTITY)
  {
    /* Call minit (if it exists) */
    if (step_mem->minit != NULL)
    {
      retval = step_mem->minit((void*)ark_mem);
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_MASSINIT_FAIL, __LINE__, __func__,
                        __FILE__, MSG_ARK_MASSINIT_FAIL);
        return (ARK_MASSINIT_FAIL);
      }
    }

    /* Call msetup (if it exists) */
    if (step_mem->msetup != NULL)
    {
      retval = step_mem->msetup((void*)ark_mem, ark_mem->tcur, ark_mem->tempv1,
                                ark_mem->tempv2, ark_mem->tempv3);
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_MASSSETUP_FAIL, __LINE__, __func__,
                        __FILE__, MSG_ARK_MASSSETUP_FAIL);
        return (ARK_MASSSETUP_FAIL);
      }
    }
  }

  /* Call linit (if it exists) */
  if (step_mem->linit)
  {
    retval = step_mem->linit(ark_mem);
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_LINIT_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_LINIT_FAIL);
      return (ARK_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver object (if it exists) */
  if (step_mem->NLS)
  {
    retval = arkStep_NlsInit(ark_mem);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_NLS_INIT_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to initialize SUNNonlinearSolver object");
      return (ARK_NLS_INIT_FAIL);
    }
  }

  /* Signal to shared arkode module that full RHS evaluations are required */
  ark_mem->call_fullrhs = SUNTRUE;

  return (ARK_SUCCESS);
}